

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

SQInteger __thiscall SQLexer::Lex(SQLexer *this)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  SQInteger SVar5;
  SQInteger SVar6;
  ulong uVar7;
  
  this->_lasttokenline = this->_currentline;
LAB_00120389:
  bVar1 = this->_currdata;
  uVar7 = (ulong)bVar1;
  switch(uVar7) {
  case 0:
    goto LAB_00120554;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x24:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    goto switchD_0012039f_caseD_1;
  case 9:
  case 0xd:
  case 0x20:
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    goto LAB_00120389;
  case 10:
    this->_currentline = this->_currentline + 1;
    this->_prevtoken = this->_curtoken;
    this->_curtoken = 10;
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = 1;
    goto LAB_00120389;
  case 0x21:
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    uVar7 = 0x21;
    if (this->_currdata == '=') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      uVar7 = 0x109;
    }
    break;
  case 0x22:
  case 0x27:
    goto LAB_001209d6;
  case 0x23:
switchD_0012039f_caseD_23:
    LexLineComment(this);
    goto LAB_00120389;
  case 0x25:
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    uVar7 = 0x25;
    if (this->_currdata == '=') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      uVar7 = 0x13f;
    }
    break;
  case 0x26:
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    uVar7 = 0x26;
    if (this->_currdata == '&') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      uVar7 = 0x10e;
    }
    break;
  case 0x28:
  case 0x29:
  case 0x2c:
  case 0x3b:
  case 0x3f:
    goto switchD_0012039f_caseD_28;
  case 0x2a:
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    uVar7 = 0x2a;
    if (this->_currdata == '=') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      uVar7 = 0x13d;
    }
    break;
  case 0x2b:
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    if (this->_currdata == '+') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      uVar7 = 0x12f;
    }
    else {
      uVar7 = 0x2b;
      if (this->_currdata == '=') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        uVar7 = 0x121;
      }
    }
    break;
  case 0x2d:
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    if (this->_currdata == '-') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      uVar7 = 0x130;
    }
    else {
      uVar7 = 0x2d;
      if (this->_currdata == '=') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        uVar7 = 0x122;
      }
    }
    break;
  case 0x2e:
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    uVar7 = 0x2e;
    if (this->_currdata == '.') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata != '.') {
        (*this->_errfunc)(this->_errtarget,"invalid token \'..\'");
      }
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      uVar7 = 0x138;
    }
    break;
  case 0x2f:
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    bVar1 = this->_currdata;
    if (0x2e < bVar1) {
      if (bVar1 != 0x2f) {
        if (bVar1 == 0x3d) {
          Next(this);
          this->_currentcolumn = this->_currentcolumn + 1;
          uVar7 = 0x13e;
          break;
        }
        if (bVar1 == 0x3e) {
          Next(this);
          this->_currentcolumn = this->_currentcolumn + 1;
          uVar7 = 0x141;
          break;
        }
        goto LAB_001208f2;
      }
      goto switchD_0012039f_caseD_23;
    }
    if (bVar1 != 0x2a) {
LAB_001208f2:
      uVar7 = 0x2f;
      break;
    }
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    LexBlockComment(this);
    goto LAB_00120389;
  case 0x3a:
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    uVar7 = 0x3a;
    if (this->_currdata == ':') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      uVar7 = 299;
    }
    break;
  case 0x3c:
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    bVar1 = this->_currdata;
    uVar7 = 0x3c;
    if (bVar1 < 0x3c) {
      if (bVar1 == 0x2d) {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        uVar7 = 0x119;
      }
      else if (bVar1 == 0x2f) {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        uVar7 = 0x140;
      }
    }
    else if (bVar1 == 0x3c) {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      uVar7 = 0x128;
    }
    else if (bVar1 == 0x3d) {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      uVar7 = 0x10a;
      if (this->_currdata == '>') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        uVar7 = 0x131;
      }
    }
    break;
  case 0x3d:
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    uVar7 = 0x3d;
    if (this->_currdata == '=') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      uVar7 = 0x108;
    }
    break;
  case 0x3e:
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    if (this->_currdata == '>') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      uVar7 = 0x129;
      if (this->_currdata == '>') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        uVar7 = 0x132;
      }
    }
    else {
      uVar7 = 0x3e;
      if (this->_currdata == '=') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        uVar7 = 0x10b;
      }
    }
    break;
  case 0x40:
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    if (this->_currdata == '\"') {
      SVar6 = ReadString(this,0x22,true);
      if (SVar6 != -1) {
        this->_prevtoken = this->_curtoken;
        this->_curtoken = SVar6;
        goto LAB_001209cc;
      }
      (*this->_errfunc)(this->_errtarget,"error parsing the string");
      bVar2 = true;
    }
    else {
      this->_prevtoken = this->_curtoken;
      this->_curtoken = 0x40;
      SVar6 = 0x40;
LAB_001209cc:
      bVar2 = false;
      SVar5 = SVar6;
    }
    if (!bVar2) {
      return SVar5;
    }
LAB_001209d6:
    SVar5 = ReadString(this,(ulong)this->_currdata,false);
    if (SVar5 != -1) {
      this->_prevtoken = this->_curtoken;
      this->_curtoken = SVar5;
      return SVar5;
    }
    (*this->_errfunc)(this->_errtarget,"error parsing the string");
switchD_0012039f_caseD_28:
    uVar7 = (ulong)this->_currdata;
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    goto LAB_00120546;
  default:
    uVar3 = bVar1 - 0x5b;
    if (uVar3 < 0x24) {
      if ((0xd0000000dU >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto switchD_0012039f_caseD_28;
      if ((ulong)uVar3 == 0x21) {
        SVar5 = (*this->_readf)(this->_up);
        if (0xff < SVar5) {
          (*this->_errfunc)(this->_errtarget,"Invalid character");
        }
        if (SVar5 == 0) {
          this->_currdata = '\0';
          this->_reached_eof = 1;
        }
        else {
          this->_currdata = (LexChar)SVar5;
        }
        this->_currentcolumn = this->_currentcolumn + 1;
        uVar7 = 0x7c;
        if (this->_currdata == '|') {
          Next(this);
          this->_currentcolumn = this->_currentcolumn + 1;
          uVar7 = 0x10f;
        }
        break;
      }
    }
    goto switchD_0012039f_caseD_1;
  }
LAB_0012054a:
  this->_prevtoken = this->_curtoken;
  this->_curtoken = uVar7;
  return uVar7;
switchD_0012039f_caseD_1:
  if (bVar1 - 0x30 < 10) {
    uVar7 = ReadNumber(this);
  }
  else {
    iVar4 = isalpha((uint)bVar1);
    if ((bVar1 == 0x5f) || (iVar4 != 0)) {
      uVar7 = ReadID(this);
    }
    else {
      iVar4 = iscntrl((uint)bVar1);
      if (iVar4 != 0) {
        (*this->_errfunc)(this->_errtarget,"unexpected character(control)");
      }
      Next(this);
LAB_00120546:
      this->_currentcolumn = this->_currentcolumn + 1;
    }
  }
  goto LAB_0012054a;
LAB_00120554:
  return 0;
}

Assistant:

SQInteger SQLexer::Lex()
{
    _lasttokenline = _currentline;
    while(CUR_CHAR != SQUIRREL_EOB) {
        switch(CUR_CHAR){
        case _SC('\t'): case _SC('\r'): case _SC(' '): NEXT(); continue;
        case _SC('\n'):
            _currentline++;
            _prevtoken=_curtoken;
            _curtoken=_SC('\n');
            NEXT();
            _currentcolumn=1;
            continue;
        case _SC('#'): LexLineComment(); continue;
        case _SC('/'):
            NEXT();
            switch(CUR_CHAR){
            case _SC('*'):
                NEXT();
                LexBlockComment();
                continue;
            case _SC('/'):
                LexLineComment();
                continue;
            case _SC('='):
                NEXT();
                RETURN_TOKEN(TK_DIVEQ);
                continue;
            case _SC('>'):
                NEXT();
                RETURN_TOKEN(TK_ATTR_CLOSE);
                continue;
            default:
                RETURN_TOKEN('/');
            }
        case _SC('='):
            NEXT();
            if (CUR_CHAR != _SC('=')){ RETURN_TOKEN('=') }
            else { NEXT(); RETURN_TOKEN(TK_EQ); }
        case _SC('<'):
            NEXT();
            switch(CUR_CHAR) {
            case _SC('='):
                NEXT();
                if(CUR_CHAR == _SC('>')) {
                    NEXT();
                    RETURN_TOKEN(TK_3WAYSCMP);
                }
                RETURN_TOKEN(TK_LE)
                break;
            case _SC('-'): NEXT(); RETURN_TOKEN(TK_NEWSLOT); break;
            case _SC('<'): NEXT(); RETURN_TOKEN(TK_SHIFTL); break;
            case _SC('/'): NEXT(); RETURN_TOKEN(TK_ATTR_OPEN); break;
            }
            RETURN_TOKEN('<');
        case _SC('>'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_GE);}
            else if(CUR_CHAR == _SC('>')){
                NEXT();
                if(CUR_CHAR == _SC('>')){
                    NEXT();
                    RETURN_TOKEN(TK_USHIFTR);
                }
                RETURN_TOKEN(TK_SHIFTR);
            }
            else { RETURN_TOKEN('>') }
        case _SC('!'):
            NEXT();
            if (CUR_CHAR != _SC('=')){ RETURN_TOKEN('!')}
            else { NEXT(); RETURN_TOKEN(TK_NE); }
        case _SC('@'): {
            SQInteger stype;
            NEXT();
            if(CUR_CHAR != _SC('"')) {
                RETURN_TOKEN('@');
            }
            if((stype=ReadString('"',true))!=-1) {
                RETURN_TOKEN(stype);
            }
            Error(_SC("error parsing the string"));
                       }
        case _SC('"'):
        case _SC('\''): {
            SQInteger stype;
            if((stype=ReadString(CUR_CHAR,false))!=-1){
                RETURN_TOKEN(stype);
            }
            Error(_SC("error parsing the string"));
            }
        case _SC('{'): case _SC('}'): case _SC('('): case _SC(')'): case _SC('['): case _SC(']'):
        case _SC(';'): case _SC(','): case _SC('?'): case _SC('^'): case _SC('~'):
            {SQInteger ret = CUR_CHAR;
            NEXT(); RETURN_TOKEN(ret); }
        case _SC('.'):
            NEXT();
            if (CUR_CHAR != _SC('.')){ RETURN_TOKEN('.') }
            NEXT();
            if (CUR_CHAR != _SC('.')){ Error(_SC("invalid token '..'")); }
            NEXT();
            RETURN_TOKEN(TK_VARPARAMS);
        case _SC('&'):
            NEXT();
            if (CUR_CHAR != _SC('&')){ RETURN_TOKEN('&') }
            else { NEXT(); RETURN_TOKEN(TK_AND); }
        case _SC('|'):
            NEXT();
            if (CUR_CHAR != _SC('|')){ RETURN_TOKEN('|') }
            else { NEXT(); RETURN_TOKEN(TK_OR); }
        case _SC(':'):
            NEXT();
            if (CUR_CHAR != _SC(':')){ RETURN_TOKEN(':') }
            else { NEXT(); RETURN_TOKEN(TK_DOUBLE_COLON); }
        case _SC('*'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_MULEQ);}
            else RETURN_TOKEN('*');
        case _SC('%'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_MODEQ);}
            else RETURN_TOKEN('%');
        case _SC('-'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_MINUSEQ);}
            else if  (CUR_CHAR == _SC('-')){ NEXT(); RETURN_TOKEN(TK_MINUSMINUS);}
            else RETURN_TOKEN('-');
        case _SC('+'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_PLUSEQ);}
            else if (CUR_CHAR == _SC('+')){ NEXT(); RETURN_TOKEN(TK_PLUSPLUS);}
            else RETURN_TOKEN('+');
        case SQUIRREL_EOB:
            return 0;
        default:{
                if (scisdigit(CUR_CHAR)) {
                    SQInteger ret = ReadNumber();
                    RETURN_TOKEN(ret);
                }
                else if (scisalpha(CUR_CHAR) || CUR_CHAR == _SC('_')) {
                    SQInteger t = ReadID();
                    RETURN_TOKEN(t);
                }
                else {
                    SQInteger c = CUR_CHAR;
                    if (sciscntrl((int)c)) Error(_SC("unexpected character(control)"));
                    NEXT();
                    RETURN_TOKEN(c);
                }
                RETURN_TOKEN(0);
            }
        }
    }
    return 0;
}